

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
TestNLHandler::OnComplementarity(TestNLHandler *this,int con_index,int var_index,ComplInfo info)

{
  undefined4 in_stack_00000030;
  int *in_stack_00000038;
  double *in_stack_00000040;
  BasicWriter<char> *in_stack_00000048;
  BasicCStringRef<char> in_stack_00000050;
  TestNLHandler *in_stack_ffffffffffffffd0;
  BasicCStringRef<char> local_20 [3];
  ComplInfo local_4;
  
  WriteSep(in_stack_ffffffffffffffd0);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_20,"{} <= c{} <= {} complements v{};");
  mp::ComplInfo::con_lb(&local_4);
  mp::ComplInfo::con_ub(&local_4);
  fmt::BasicWriter<char>::write<double,int,double,int>
            (in_stack_00000048,in_stack_00000050,in_stack_00000040,in_stack_00000038,
             (double *)CONCAT44(info.flags_,in_stack_00000030),(int *)this);
  return;
}

Assistant:

void OnComplementarity(int con_index, int var_index, mp::ComplInfo info) {
    WriteSep().write("{} <= c{} <= {} complements v{};",
                     info.con_lb(), con_index, info.con_ub(), var_index);
  }